

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall
merlin::factor::logsumexp(factor *__return_storage_ptr__,factor *this,variable_set *sum_out)

{
  factor *B;
  double __x;
  double __x_00;
  factor local_130;
  undefined1 local_d0 [8];
  factor Scaled;
  undefined1 local_58 [8];
  variable_set target;
  variable_set *sum_out_local;
  factor *this_local;
  factor *mx;
  
  target.m_d = (vsize *)sum_out;
  variable_set::operator-((variable_set *)local_58,&this->v_,sum_out);
  maxmarginal(__return_storage_ptr__,this,(variable_set *)local_58);
  operator-((factor *)local_d0,this,__return_storage_ptr__);
  exp((factor *)local_d0,__x);
  marginal(&local_130,(factor *)local_d0,(variable_set *)local_58);
  log(&local_130,__x_00);
  operator+=(__return_storage_ptr__,B);
  ~factor(&local_130);
  ~factor((factor *)local_d0);
  variable_set::~variable_set((variable_set *)local_58);
  return __return_storage_ptr__;
}

Assistant:

factor logsumexp(const variable_set& sum_out) const {
		variable_set target = v_ - sum_out;
		factor mx = maxmarginal(target);
		factor Scaled = *this - mx;
		Scaled.exp();
		mx += Scaled.marginal(target).log();
		return mx;
	}